

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_verify
              (mbedtls_ecp_group *grp,uchar *buf,size_t blen,mbedtls_ecp_point *Q,mbedtls_mpi *r,
              mbedtls_mpi *s)

{
  mbedtls_mpi_uint **R_00;
  int iVar1;
  undefined1 local_f0 [8];
  mbedtls_ecp_point R;
  mbedtls_mpi u2;
  mbedtls_mpi u1;
  mbedtls_mpi s_inv;
  mbedtls_mpi e;
  int ret;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_point *Q_local;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_ecp_point_init((mbedtls_ecp_point *)local_f0);
  mbedtls_mpi_init((mbedtls_mpi *)&s_inv.p);
  mbedtls_mpi_init((mbedtls_mpi *)&u1.p);
  mbedtls_mpi_init((mbedtls_mpi *)&u2.p);
  mbedtls_mpi_init((mbedtls_mpi *)&R.Z.p);
  if ((grp->N).p == (mbedtls_mpi_uint *)0x0) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(r,1);
    if ((((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(r,&grp->N), -1 < iVar1)) ||
        (iVar1 = mbedtls_mpi_cmp_int(s,1), iVar1 < 0)) ||
       (iVar1 = mbedtls_mpi_cmp_mpi(s,&grp->N), -1 < iVar1)) {
      e.p._4_4_ = -0x4e00;
    }
    else {
      e.p._4_4_ = mbedtls_ecp_check_pubkey(grp,Q);
      if (((((e.p._4_4_ == 0) &&
            (e.p._4_4_ = derive_mpi(grp,(mbedtls_mpi *)&s_inv.p,buf,blen), e.p._4_4_ == 0)) &&
           ((e.p._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&u1.p,s,&grp->N), e.p._4_4_ == 0 &&
            ((e.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&u2.p,(mbedtls_mpi *)&s_inv.p,
                                              (mbedtls_mpi *)&u1.p), e.p._4_4_ == 0 &&
             (e.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&u2.p,(mbedtls_mpi *)&u2.p,&grp->N),
             e.p._4_4_ == 0)))))) &&
          (e.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&R.Z.p,r,(mbedtls_mpi *)&u1.p),
          e.p._4_4_ == 0)) &&
         ((R_00 = &R.Z.p,
          e.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)R_00,(mbedtls_mpi *)R_00,&grp->N),
          e.p._4_4_ == 0 &&
          (e.p._4_4_ = mbedtls_ecp_muladd(grp,(mbedtls_ecp_point *)local_f0,(mbedtls_mpi *)&u2.p,
                                          &grp->G,(mbedtls_mpi *)&R.Z.p,Q), e.p._4_4_ == 0)))) {
        iVar1 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)local_f0);
        if (iVar1 == 0) {
          e.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_f0,(mbedtls_mpi *)local_f0,&grp->N);
          if ((e.p._4_4_ == 0) &&
             (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)local_f0,r), iVar1 != 0)) {
            e.p._4_4_ = -0x4e00;
          }
        }
        else {
          e.p._4_4_ = -0x4e00;
        }
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)local_f0);
    mbedtls_mpi_free((mbedtls_mpi *)&s_inv.p);
    mbedtls_mpi_free((mbedtls_mpi *)&u1.p);
    mbedtls_mpi_free((mbedtls_mpi *)&u2.p);
    mbedtls_mpi_free((mbedtls_mpi *)&R.Z.p);
    grp_local._4_4_ = e.p._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_verify( mbedtls_ecp_group *grp,
                  const unsigned char *buf, size_t blen,
                  const mbedtls_ecp_point *Q, const mbedtls_mpi *r, const mbedtls_mpi *s)
{
    int ret;
    mbedtls_mpi e, s_inv, u1, u2;
    mbedtls_ecp_point R;

    mbedtls_ecp_point_init( &R );
    mbedtls_mpi_init( &e ); mbedtls_mpi_init( &s_inv ); mbedtls_mpi_init( &u1 ); mbedtls_mpi_init( &u2 );

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if( grp->N.p == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Step 1: make sure r and s are in range 1..n-1
     */
    if( mbedtls_mpi_cmp_int( r, 1 ) < 0 || mbedtls_mpi_cmp_mpi( r, &grp->N ) >= 0 ||
        mbedtls_mpi_cmp_int( s, 1 ) < 0 || mbedtls_mpi_cmp_mpi( s, &grp->N ) >= 0 )
    {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Additional precaution: make sure Q is valid
     */
    MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, Q ) );

    /*
     * Step 3: derive MPI from hashed message
     */
    MBEDTLS_MPI_CHK( derive_mpi( grp, &e, buf, blen ) );

    /*
     * Step 4: u1 = e / s mod n, u2 = r / s mod n
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &s_inv, s, &grp->N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &u1, &e, &s_inv ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &u1, &u1, &grp->N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &u2, r, &s_inv ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &u2, &u2, &grp->N ) );

    /*
     * Step 5: R = u1 G + u2 Q
     *
     * Since we're not using any secret data, no need to pass a RNG to
     * mbedtls_ecp_mul() for countermesures.
     */
    MBEDTLS_MPI_CHK( mbedtls_ecp_muladd( grp, &R, &u1, &grp->G, &u2, Q ) );

    if( mbedtls_ecp_is_zero( &R ) )
    {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Step 6: convert xR to an integer (no-op)
     * Step 7: reduce xR mod n (gives v)
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &R.X, &R.X, &grp->N ) );

    /*
     * Step 8: check if v (that is, R.X) is equal to r
     */
    if( mbedtls_mpi_cmp_mpi( &R.X, r ) != 0 )
    {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free( &R );
    mbedtls_mpi_free( &e ); mbedtls_mpi_free( &s_inv ); mbedtls_mpi_free( &u1 ); mbedtls_mpi_free( &u2 );

    return( ret );
}